

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTruths)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong local_60;
  ulong local_50;
  word uTruth1;
  word uTruth0;
  Vec_Wrd_t *vTruths_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    if ((*(ulong *)pObj >> 0x1e & 1) != 0) {
      __assert_fail("!pObj->fMark0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                    ,0x6d,
                    "void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)");
    }
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                    ,0x6e,
                    "void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)");
    }
    pGVar3 = Gia_ObjFanin0(pObj);
    Gia_ObjComputeTruthTable6_rec(p,pGVar3,vTruths);
    pGVar3 = Gia_ObjFanin1(pObj);
    Gia_ObjComputeTruthTable6_rec(p,pGVar3,vTruths);
    pGVar3 = Gia_ObjFanin0(pObj);
    local_50 = Vec_WrdEntry(vTruths,pGVar3->Value);
    iVar1 = Gia_ObjFaninC0(pObj);
    if (iVar1 != 0) {
      local_50 = local_50 ^ 0xffffffffffffffff;
    }
    pGVar3 = Gia_ObjFanin1(pObj);
    local_60 = Vec_WrdEntry(vTruths,pGVar3->Value);
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_60 = local_60 ^ 0xffffffffffffffff;
    }
    uVar2 = Vec_WrdSize(vTruths);
    pObj->Value = uVar2;
    Vec_WrdPush(vTruths,local_50 & local_60);
  }
  return;
}

Assistant:

void Gia_ObjComputeTruthTable6_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTruths )
{
    word uTruth0, uTruth1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( !pObj->fMark0 );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin0(pObj), vTruths );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin1(pObj), vTruths );
    uTruth0 = Vec_WrdEntry( vTruths, Gia_ObjFanin0(pObj)->Value );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTruths, Gia_ObjFanin1(pObj)->Value );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    pObj->Value = Vec_WrdSize(vTruths);
    Vec_WrdPush( vTruths, uTruth0 & uTruth1 );
}